

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.hh
# Opt level: O2

Scalar __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_dihedral_angle
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,HalfedgeHandle _heh)

{
  bool bVar1;
  Scalar SVar2;
  double dVar3;
  undefined1 local_70 [8];
  Normal n0;
  Normal n1;
  Normal he;
  
  bVar1 = PolyConnectivity::is_boundary
                    ((PolyConnectivity *)this,(EdgeHandle)((int)_heh.super_BaseHandle.idx_ >> 1));
  SVar2 = 0.0;
  if (!bVar1) {
    calc_sector_normal(this,_heh,(Normal *)local_70);
    calc_sector_normal(this,(HalfedgeHandle)
                            ((-((uint)_heh.super_BaseHandle.idx_ & 1) | 1) +
                            (int)_heh.super_BaseHandle.idx_),
                       (Normal *)(n0.super_VectorDataT<double,_3>.values_ + 2));
    calc_edge_vector(this,_heh,(Normal *)(n1.super_VectorDataT<double,_3>.values_ + 2));
    dVar3 = SQRT(n1.super_VectorDataT<double,_3>.values_[1] *
                 n1.super_VectorDataT<double,_3>.values_[1] +
                 n0.super_VectorDataT<double,_3>.values_[2] *
                 n0.super_VectorDataT<double,_3>.values_[2] +
                 n1.super_VectorDataT<double,_3>.values_[0] *
                 n1.super_VectorDataT<double,_3>.values_[0]) *
            SQRT(n0.super_VectorDataT<double,_3>.values_[1] *
                 n0.super_VectorDataT<double,_3>.values_[1] +
                 (double)local_70 * (double)local_70 +
                 n0.super_VectorDataT<double,_3>.values_[0] *
                 n0.super_VectorDataT<double,_3>.values_[0]);
    SVar2 = 0.0;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      SVar2 = angle<double>((n0.super_VectorDataT<double,_3>.values_[1] *
                             n1.super_VectorDataT<double,_3>.values_[1] +
                            n0.super_VectorDataT<double,_3>.values_[0] *
                            n1.super_VectorDataT<double,_3>.values_[0] +
                            (double)local_70 * n0.super_VectorDataT<double,_3>.values_[2] + 0.0) /
                            dVar3,((double)local_70 * n1.super_VectorDataT<double,_3>.values_[0] -
                                  n0.super_VectorDataT<double,_3>.values_[2] *
                                  n0.super_VectorDataT<double,_3>.values_[0]) *
                                  he.super_VectorDataT<double,_3>.values_[1] +
                                  (n0.super_VectorDataT<double,_3>.values_[1] *
                                   n0.super_VectorDataT<double,_3>.values_[2] -
                                  n1.super_VectorDataT<double,_3>.values_[1] * (double)local_70) *
                                  he.super_VectorDataT<double,_3>.values_[0] +
                                  (n0.super_VectorDataT<double,_3>.values_[0] *
                                   n1.super_VectorDataT<double,_3>.values_[1] -
                                  n1.super_VectorDataT<double,_3>.values_[0] *
                                  n0.super_VectorDataT<double,_3>.values_[1]) *
                                  n1.super_VectorDataT<double,_3>.values_[2] + 0.0);
    }
  }
  return SVar2;
}

Assistant:

Scalar calc_dihedral_angle(HalfedgeHandle _heh) const
  {
    if (this->is_boundary(this->edge_handle(_heh)))
    {//the dihedral angle at a boundary edge is 0
      return 0;
    }
    Normal n0, n1, he;
    calc_sector_normal(_heh, n0);
    calc_sector_normal(this->opposite_halfedge_handle(_heh), n1);
    calc_edge_vector(_heh, he);
    Scalar denom = n0.norm()*n1.norm();
    if (denom == Scalar(0))
    {
      return 0;
    }
    Scalar da_cos = dot(n0, n1)/denom;
    //should be normalized, but we need only the sign
    Scalar da_sin_sign = dot(cross(n0, n1), he);
    return angle(da_cos, da_sin_sign);
  }